

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O1

MetadataHandle * __thiscall
duckdb::MetadataManager::AllocateHandle
          (MetadataHandle *__return_storage_ptr__,MetadataManager *this)

{
  pointer *ppuVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  __node_base *p_Var4;
  undefined4 extraout_var;
  mapped_type *metadata_block;
  BlockHandle *pBVar5;
  byte *pbVar6;
  ulong uVar7;
  block_id_t free_block;
  MetadataPointer pointer;
  _Hash_node_base *local_30;
  MetadataPointer local_28;
  
  local_30 = (_Hash_node_base *)0xffffffffffffffff;
  p_Var4 = &(this->blocks)._M_h._M_before_begin;
  do {
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) goto LAB_010a19cb;
  } while (p_Var4[5]._M_nxt == p_Var4[6]._M_nxt);
  local_30 = p_Var4[1]._M_nxt;
LAB_010a19cb:
  p_Var2 = local_30;
  if (local_30 != (_Hash_node_base *)0xffffffffffffffff) {
    iVar3 = (*this->block_manager->_vptr_BlockManager[5])();
    if ((long)p_Var2 <= CONCAT44(extraout_var,iVar3)) goto LAB_010a19f1;
  }
  local_30 = (_Hash_node_base *)AllocateNewBlock(this);
LAB_010a19f1:
  uVar7 = (ulong)local_30 & 0xffffffffffffff;
  local_28 = (MetadataPointer)((ulong)(byte)local_28._7_1_ << 0x38 | uVar7);
  metadata_block =
       ::std::__detail::
       _Map_base<long,_std::pair<const_long,_duckdb::MetadataBlock>,_std::allocator<std::pair<const_long,_duckdb::MetadataBlock>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
       ::operator[]((_Map_base<long,_std::pair<const_long,_duckdb::MetadataBlock>,_std::allocator<std::pair<const_long,_duckdb::MetadataBlock>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->blocks,(key_type *)&local_30);
  pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&metadata_block->block);
  if (pBVar5->block_id < 0x4000000000000060) {
    ConvertToTransient(this,metadata_block);
  }
  pbVar6 = vector<unsigned_char,_true>::back(&metadata_block->free_blocks);
  local_28 = (MetadataPointer)((ulong)*pbVar6 << 0x38 | uVar7);
  ppuVar1 = &(metadata_block->free_blocks).
             super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  Pin(__return_storage_ptr__,this,&local_28);
  return __return_storage_ptr__;
}

Assistant:

MetadataHandle MetadataManager::AllocateHandle() {
	// check if there is any free space left in an existing block
	// if not allocate a new block
	block_id_t free_block = INVALID_BLOCK;
	for (auto &kv : blocks) {
		auto &block = kv.second;
		D_ASSERT(kv.first == block.block_id);
		if (!block.free_blocks.empty()) {
			free_block = kv.first;
			break;
		}
	}
	if (free_block == INVALID_BLOCK || free_block > PeekNextBlockId()) {
		free_block = AllocateNewBlock();
	}
	D_ASSERT(free_block != INVALID_BLOCK);

	// select the first free metadata block we can find
	MetadataPointer pointer;
	pointer.block_index = UnsafeNumericCast<idx_t>(free_block);
	auto &block = blocks[free_block];
	if (block.block->BlockId() < MAXIMUM_BLOCK) {
		// this block is a disk-backed block, yet we are planning to write to it
		// we need to convert it into a transient block before we can write to it
		ConvertToTransient(block);
		D_ASSERT(block.block->BlockId() >= MAXIMUM_BLOCK);
	}
	D_ASSERT(!block.free_blocks.empty());
	pointer.index = block.free_blocks.back();
	// mark the block as used
	block.free_blocks.pop_back();
	D_ASSERT(pointer.index < METADATA_BLOCK_COUNT);
	// pin the block
	return Pin(pointer);
}